

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearSpeed::Update
          (ChLinkMotorLinearSpeed *this,double mytime,bool update_assets)

{
  Scalar *pSVar1;
  double dVar2;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  dVar2 = 0.0;
  if (this->avoid_position_drift == true) {
    dVar2 = ((this->super_ChLinkMotorLinear).mpos - this->aux_dt) -
            *(double *)&(this->super_ChLinkMotorLinear).field_0x278;
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                      &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C,0
                     );
  *pSVar1 = dVar2;
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Add the time-dependent term in residual C as
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A- x_pos_B, and d_setpoint = x(t)
    if (this->avoid_position_drift)
        C(0) = this->mpos - aux_dt - this->pos_offset;
    else
        C(0) = 0.0;
}